

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O2

int Gia_ManCountDepth(Gia_ManEra_t *p)

{
  uint uVar1;
  Vec_Ptr_t *p_00;
  Gia_ObjEra_t *pGVar2;
  int iVar3;
  
  p_00 = p->vStates;
  uVar1 = p_00->nSize;
  if (0 < (long)(int)uVar1) {
    pGVar2 = (Gia_ObjEra_t *)p_00->pArray[(long)(int)uVar1 + -1];
    if ((3 < uVar1) && (pGVar2->iPrev == 0)) {
      pGVar2 = (Gia_ObjEra_t *)Vec_PtrEntry(p_00,uVar1 - 2);
    }
    iVar3 = 0;
    while (pGVar2 != (Gia_ObjEra_t *)0x0) {
      if (pGVar2->iPrev == 0) {
        pGVar2 = (Gia_ObjEra_t *)0x0;
      }
      else {
        pGVar2 = Gia_ManEraState(p,pGVar2->iPrev);
      }
      iVar3 = iVar3 + 1;
    }
    return iVar3;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
}

Assistant:

int Gia_ManCountDepth( Gia_ManEra_t * p )
{
    Gia_ObjEra_t * pState;
    int Counter = 0;
    pState = (Gia_ObjEra_t *)Vec_PtrEntryLast( p->vStates );
    if ( pState->iPrev == 0 && Vec_PtrSize(p->vStates) > 3 )
        pState = (Gia_ObjEra_t *)Vec_PtrEntry( p->vStates, Vec_PtrSize(p->vStates) - 2 );
    for ( ; pState; pState = pState->iPrev ? Gia_ManEraState(p, pState->iPrev) : NULL )
        Counter++;
    return Counter;
}